

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::count_digits<4u>
          (int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>> *this)

{
  int local_18;
  uint local_14;
  int num_digits;
  unsigned_type n;
  int_writer<unsigned_int,_fmt::v5::basic_format_specs<wchar_t>_> *this_local;
  
  local_14 = *(uint *)(this + 0x10);
  local_18 = 0;
  do {
    local_18 = local_18 + 1;
    local_14 = local_14 >> 4;
  } while (local_14 != 0);
  return local_18;
}

Assistant:

int count_digits() const {
      unsigned_type n = abs_value;
      int num_digits = 0;
      do {
        ++num_digits;
      } while ((n >>= BITS) != 0);
      return num_digits;
    }